

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

char * libssh2_userauth_list(LIBSSH2_SESSION *session,char *user,uint user_len)

{
  uchar **data;
  size_t *data_len;
  int iVar1;
  uint32_t uVar2;
  time_t start_time;
  uchar *puVar3;
  char *pcVar4;
  ulong uVar5;
  uchar reply_codes [4];
  uchar *local_48;
  ulong local_40;
  char *local_38;
  
  local_38 = user;
  start_time = time((time_t *)0x0);
  local_40 = (ulong)user_len;
  data = &session->userauth_list_data;
  data_len = &session->userauth_list_data_len;
  do {
    builtin_memcpy(reply_codes,"435",4);
    if (session->userauth_list_state == libssh2_NB_state_idle) {
      (session->userauth_list_packet_requirev_state).start = 0;
      session->userauth_list_data_len = (ulong)(user_len + 0x1b);
      puVar3 = (uchar *)(*session->alloc)((ulong)(user_len + 0x1b),&session->abstract);
      session->userauth_list_data = puVar3;
      if (puVar3 != (uchar *)0x0) {
        local_48 = puVar3 + 1;
        *puVar3 = '2';
        _libssh2_store_str(&local_48,local_38,local_40);
        _libssh2_store_str(&local_48,"ssh-connection",0xe);
        _libssh2_store_u32(&local_48,4);
        session->userauth_list_state = libssh2_NB_state_created;
        goto LAB_00128c63;
      }
      iVar1 = -6;
      pcVar4 = "Unable to allocate memory for userauth_list";
      local_48 = (uchar *)0x0;
      goto LAB_00128d37;
    }
LAB_00128c63:
    if (session->userauth_list_state == libssh2_NB_state_created) {
      iVar1 = _libssh2_transport_send
                        (session,session->userauth_list_data,session->userauth_list_data_len,
                         (uchar *)"none",4);
      if (iVar1 == -0x25) {
LAB_00128d28:
        iVar1 = -0x25;
        pcVar4 = "Would block requesting userauth list";
        goto LAB_00128d37;
      }
      (*session->free)(session->userauth_list_data,&session->abstract);
      session->userauth_list_data = (uchar *)0x0;
      if (iVar1 == 0) {
        session->userauth_list_state = libssh2_NB_state_sent;
        goto LAB_00128cea;
      }
      iVar1 = -7;
      pcVar4 = "Unable to send userauth-none request";
LAB_00128e79:
      _libssh2_error(session,iVar1,pcVar4);
LAB_00128e7e:
      session->userauth_list_state = libssh2_NB_state_idle;
LAB_00128e89:
      puVar3 = (uchar *)0x0;
    }
    else {
LAB_00128cea:
      if (session->userauth_list_state == libssh2_NB_state_sent) {
        iVar1 = _libssh2_packet_requirev
                          (session,reply_codes,data,data_len,0,(uchar *)0x0,0,
                           &session->userauth_list_packet_requirev_state);
        if (iVar1 != 0) {
LAB_00128d1f:
          if (iVar1 == -0x25) goto LAB_00128d28;
LAB_00128e6d:
          pcVar4 = "Failed getting response";
          goto LAB_00128e79;
        }
        if (*data_len == 0) goto LAB_00128e6d;
        puVar3 = *data;
        if (*puVar3 != '5') {
LAB_00128e30:
          puVar3 = *data;
          if (*puVar3 != '4') {
            if (*data_len < 5) goto LAB_00128e94;
            uVar2 = _libssh2_ntohu32(puVar3 + 1);
            uVar5 = (ulong)uVar2;
            if (uVar5 < *data_len - 5) {
              memmove(*data,*data + 5,uVar5);
              (*data)[uVar5] = '\0';
              goto LAB_00128eea;
            }
            iVar1 = -0x29;
            pcVar4 = "Unexpected userauth list size";
            goto LAB_00128d37;
          }
          _libssh2_error(session,0,"No error");
          (*session->free)(session->userauth_list_data,&session->abstract);
          session->userauth_list_data = (uchar *)0x0;
          *(byte *)&session->state = (byte)session->state | 4;
          goto LAB_00128e7e;
        }
        if (*data_len < 5) {
LAB_00128e94:
          (*session->free)(puVar3,&session->abstract);
          session->userauth_list_data = (uchar *)0x0;
          iVar1 = -0xe;
          pcVar4 = "Unexpected packet size";
        }
        else {
          uVar2 = _libssh2_ntohu32(puVar3 + 1);
          uVar5 = (ulong)uVar2;
          if (*data_len - 5 < uVar5) {
            (*session->free)(session->userauth_list_data,&session->abstract);
            session->userauth_list_data = (uchar *)0x0;
            iVar1 = -0x29;
            pcVar4 = "Unexpected userauth banner size";
          }
          else {
            pcVar4 = (char *)(*session->alloc)((long)uVar2 + 1,&session->abstract);
            session->userauth_banner = pcVar4;
            if (pcVar4 != (char *)0x0) {
              memcpy(pcVar4,session->userauth_list_data + 5,uVar5);
              session->userauth_banner[uVar5] = '\0';
              (*session->free)(session->userauth_list_data,&session->abstract);
              session->userauth_list_data = (uchar *)0x0;
              reply_codes[2] = '\0';
              iVar1 = _libssh2_packet_requirev
                                (session,reply_codes,data,data_len,0,(uchar *)0x0,0,
                                 &session->userauth_list_packet_requirev_state);
              if (iVar1 != 0) goto LAB_00128d1f;
              if (*data_len == 0) goto LAB_00128e6d;
              goto LAB_00128e30;
            }
            (*session->free)(session->userauth_list_data,&session->abstract);
            session->userauth_list_data = (uchar *)0x0;
            iVar1 = -6;
            pcVar4 = "Unable to allocate memory for userauth_banner";
          }
        }
LAB_00128d37:
        _libssh2_error(session,iVar1,pcVar4);
        goto LAB_00128e89;
      }
LAB_00128eea:
      session->userauth_list_state = libssh2_NB_state_idle;
      puVar3 = session->userauth_list_data;
    }
    if ((((session->api_block_mode == 0) || (puVar3 != (uchar *)0x0)) ||
        (iVar1 = libssh2_session_last_errno(session), iVar1 != -0x25)) ||
       (iVar1 = _libssh2_wait_socket(session,start_time), iVar1 != 0)) {
      return (char *)puVar3;
    }
  } while( true );
}

Assistant:

static char *userauth_list(LIBSSH2_SESSION *session, const char *username,
                           unsigned int username_len)
{
    unsigned char reply_codes[4] =
        { SSH_MSG_USERAUTH_SUCCESS, SSH_MSG_USERAUTH_FAILURE,
          SSH_MSG_USERAUTH_BANNER, 0 };
    /* packet_type(1) + username_len(4) + service_len(4) +
       service(14)"ssh-connection" + method_len(4) = 27 */
    unsigned long methods_len;
    unsigned int banner_len;
    unsigned char *s;
    int rc;

    if(session->userauth_list_state == libssh2_NB_state_idle) {
        /* Zero the whole thing out */
        memset(&session->userauth_list_packet_requirev_state, 0,
               sizeof(session->userauth_list_packet_requirev_state));

        session->userauth_list_data_len = username_len + 27;

        s = session->userauth_list_data =
            LIBSSH2_ALLOC(session, session->userauth_list_data_len);
        if(!session->userauth_list_data) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for userauth_list");
            return NULL;
        }

        *(s++) = SSH_MSG_USERAUTH_REQUEST;
        _libssh2_store_str(&s, username, username_len);
        _libssh2_store_str(&s, "ssh-connection", 14);
        _libssh2_store_u32(&s, 4); /* send "none" separately */

        session->userauth_list_state = libssh2_NB_state_created;
    }

    if(session->userauth_list_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, session->userauth_list_data,
                                     session->userauth_list_data_len,
                                     (unsigned char *)"none", 4);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting userauth list");
            return NULL;
        }
        /* now free the packet that was sent */
        LIBSSH2_FREE(session, session->userauth_list_data);
        session->userauth_list_data = NULL;

        if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send userauth-none request");
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        session->userauth_list_state = libssh2_NB_state_sent;
    }

    if(session->userauth_list_state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_requirev(session, reply_codes,
                                      &session->userauth_list_data,
                                      &session->userauth_list_data_len, 0,
                                      NULL, 0,
                               &session->userauth_list_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting userauth list");
            return NULL;
        }
        else if(rc || (session->userauth_list_data_len < 1)) {
            _libssh2_error(session, rc, "Failed getting response");
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        if(session->userauth_list_data[0] == SSH_MSG_USERAUTH_BANNER) {
            if(session->userauth_list_data_len < 5) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                               "Unexpected packet size");
                return NULL;
            }
            banner_len = _libssh2_ntohu32(session->userauth_list_data + 1);
            if(banner_len > session->userauth_list_data_len - 5) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                               "Unexpected userauth banner size");
                return NULL;
            }
            session->userauth_banner = LIBSSH2_ALLOC(session, banner_len + 1);
            if(!session->userauth_banner) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for userauth_banner");
                return NULL;
            }
            memcpy(session->userauth_banner, session->userauth_list_data + 5,
                    banner_len);
            session->userauth_banner[banner_len] = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                           "Banner: %s",
                           session->userauth_banner));
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            /* SSH_MSG_USERAUTH_BANNER has been handled */
            reply_codes[2] = 0;
            rc = _libssh2_packet_requirev(session, reply_codes,
                                          &session->userauth_list_data,
                                          &session->userauth_list_data_len, 0,
                                          NULL, 0,
                                &session->userauth_list_packet_requirev_state);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block requesting userauth list");
                return NULL;
            }
            else if(rc || (session->userauth_list_data_len < 1)) {
                _libssh2_error(session, rc, "Failed getting response");
                session->userauth_list_state = libssh2_NB_state_idle;
                return NULL;
            }
        }

        if(session->userauth_list_data[0] == SSH_MSG_USERAUTH_SUCCESS) {
            /* Wow, who'dve thought... */
            _libssh2_error(session, LIBSSH2_ERROR_NONE, "No error");
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            session->state |= LIBSSH2_STATE_AUTHENTICATED;
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        if(session->userauth_list_data_len < 5) {
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "Unexpected packet size");
            return NULL;
        }

        methods_len = _libssh2_ntohu32(session->userauth_list_data + 1);
        if(methods_len >= session->userauth_list_data_len - 5) {
            _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                           "Unexpected userauth list size");
            return NULL;
        }

        /* Do note that the memory areas overlap! */
        memmove(session->userauth_list_data, session->userauth_list_data + 5,
                methods_len);
        session->userauth_list_data[methods_len] = '\0';
        _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                       "Permitted auth methods: %s",
                       session->userauth_list_data));
    }

    session->userauth_list_state = libssh2_NB_state_idle;
    return (char *)session->userauth_list_data;
}